

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O0

int ON_ParseAngleExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,double *angle_value,
              ON_ParseSettings *parse_results,AngleUnitSystem *str_angle_unit_system)

{
  ON_ParseSettings parse_settings_00;
  ON_ParseSettings parse_settings_01;
  ON_ParseSettings parse_settings_02;
  ON_ParseSettings parse_settings_03;
  bool bVar1;
  ON__UINT32 aOVar2 [2];
  ON__UINT32 aOVar3 [2];
  undefined8 uVar4;
  ON__UINT16 OVar5;
  ON__UINT8 OVar6;
  ON__UINT8 OVar7;
  ON__UINT64 OVar8;
  undefined8 uVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  wchar_t *str_00;
  double dVar13;
  int local_1fc;
  int local_1e4;
  bool local_1d1;
  double right_angle;
  undefined1 auStack_198 [4];
  int next_str_index;
  ON_ParseSettings next_pr;
  double dStack_170;
  AngleUnitSystem next_us;
  double next_value;
  double dStack_160;
  int next_value_pass;
  double arc_seconds_value;
  double arc_minutes_value;
  ON_ParseSettings next_parse_settings;
  int end_of_unit_index;
  int local_c4;
  undefined1 auStack_c0 [4];
  int str_number_index;
  ON_ParseSettings pr1;
  int str_number_count;
  ON__UINT32 cSurveyorsNotationEW;
  ON__UINT32 cSurveyorsNotationNS;
  int str_index;
  bool bNegativeDegreesMinutesSecondsIsPossible;
  ON_ParseSettings pr;
  ON_ParseSettings input_parse_settings;
  double dStack_40;
  AngleUnitSystem angle_us;
  double x;
  AngleUnitSystem *str_angle_unit_system_local;
  ON_ParseSettings *parse_results_local;
  double *angle_value_local;
  wchar_t *pwStack_18;
  int str_count_local;
  wchar_t *str_local;
  
  OVar8 = ON_ParseSettings::FalseSettings.m_reserved;
  uVar4 = ON_ParseSettings::FalseSettings._16_8_;
  aOVar3 = ON_ParseSettings::FalseSettings.m_false_default_bits;
  aOVar2 = ON_ParseSettings::FalseSettings.m_true_default_bits;
  dStack_40 = -1.23432101234321e+308;
  input_parse_settings.m_reserved._7_1_ = None;
  pr.m_reserved._0_4_ = parse_settings.m_true_default_bits[0];
  pr.m_reserved._4_4_ = parse_settings.m_true_default_bits[1];
  input_parse_settings.m_true_default_bits[0] = parse_settings.m_false_default_bits[0];
  input_parse_settings.m_true_default_bits[1] = parse_settings.m_false_default_bits[1];
  input_parse_settings.m_false_default_bits = (ON__UINT32  [2])parse_settings._16_8_;
  input_parse_settings.m_reserved_bits = (undefined4)parse_settings.m_reserved;
  input_parse_settings.m_context_locale_id = parse_settings.m_reserved._4_2_;
  input_parse_settings.m_context_angle_unit_system = parse_settings.m_reserved._6_1_;
  input_parse_settings.m_context_length_unit_system = parse_settings.m_reserved._7_1_;
  _str_index = ON_ParseSettings::FalseSettings.m_true_default_bits;
  pr.m_true_default_bits = ON_ParseSettings::FalseSettings.m_false_default_bits;
  pr.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
  pr._16_8_ = ON_ParseSettings::FalseSettings.m_reserved;
  if (angle_value != (double *)0x0) {
    *angle_value = -1.23432101234321e+308;
  }
  if (str_angle_unit_system != (AngleUnitSystem *)0x0) {
    *str_angle_unit_system = None;
  }
  if (parse_results != (ON_ParseSettings *)0x0) {
    *&parse_results->m_true_default_bits = aOVar2;
    *&parse_results->m_false_default_bits = aOVar3;
    uVar9 = ON_ParseSettings::FalseSettings._16_8_;
    ON_ParseSettings::FalseSettings.m_reserved_bits = (ON__UINT32)uVar4;
    ON_ParseSettings::FalseSettings.m_context_locale_id = SUB82(uVar4,4);
    OVar5 = ON_ParseSettings::FalseSettings.m_context_locale_id;
    ON_ParseSettings::FalseSettings.m_context_angle_unit_system = SUB81(uVar4,6);
    OVar6 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    ON_ParseSettings::FalseSettings.m_context_length_unit_system = SUB81(uVar4,7);
    OVar7 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    ON_ParseSettings::FalseSettings._16_8_ = uVar9;
    parse_results->m_context_locale_id = OVar5;
    parse_results->m_context_angle_unit_system = OVar6;
    parse_results->m_context_length_unit_system = OVar7;
    parse_results->m_reserved = OVar8;
  }
  bVar1 = false;
  cSurveyorsNotationEW = 0;
  x = (double)str_angle_unit_system;
  str_angle_unit_system_local = (AngleUnitSystem *)parse_results;
  parse_results_local = (ON_ParseSettings *)angle_value;
  angle_value_local._4_4_ = str_count;
  pwStack_18 = str;
  bVar10 = ON_ParseSettings::ParseSurveyorsNotation((ON_ParseSettings *)&pr.m_reserved);
  if (bVar10) {
    if ((((0 < angle_value_local._4_4_) || (angle_value_local._4_4_ == -1)) &&
        (bVar10 = ON_ParseSettings::ParseLeadingWhiteSpace((ON_ParseSettings *)&pr.m_reserved),
        bVar10)) &&
       (bVar10 = ON_ParseSettings::IsLeadingWhiteSpace
                           ((ON_ParseSettings *)&pr.m_reserved,*pwStack_18), bVar10)) {
      ON_ParseSettings::SetParseLeadingWhiteSpace((ON_ParseSettings *)&str_index,true);
      while( true ) {
        local_1d1 = false;
        if ((int)cSurveyorsNotationEW < angle_value_local._4_4_) {
          local_1d1 = ON_ParseSettings::IsLeadingWhiteSpace
                                ((ON_ParseSettings *)&pr.m_reserved,
                                 pwStack_18[(int)cSurveyorsNotationEW]);
        }
        if (local_1d1 == false) break;
        cSurveyorsNotationEW = cSurveyorsNotationEW + 1;
      }
    }
    ON_ParseSettings::SetParseLeadingWhiteSpace((ON_ParseSettings *)&pr.m_reserved,false);
    if ((((int)(cSurveyorsNotationEW + 3) <= angle_value_local._4_4_) ||
        (angle_value_local._4_4_ == -1)) &&
       (uVar11 = pwStack_18[(int)cSurveyorsNotationEW] + L'\xffffffb2',
       uVar11 < 0x25 || pwStack_18[(int)cSurveyorsNotationEW] == L's')) {
      iVar12 = (*(code *)(&DAT_00a05694 + *(int *)(&DAT_00a05694 + (ulong)uVar11 * 4)))();
      return iVar12;
    }
    if (angle_value_local._4_4_ < 1) {
      local_1e4 = angle_value_local._4_4_;
    }
    else {
      local_1e4 = angle_value_local._4_4_ - cSurveyorsNotationEW;
    }
    pr1.m_reserved._4_4_ = local_1e4;
    auStack_c0 = (undefined1  [4])ON_ParseSettings::FalseSettings.m_true_default_bits[0];
    str_number_index = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
    pr1.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
    pr1.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
    pr1.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
    pr1.m_reserved_bits = (undefined4)ON_ParseSettings::FalseSettings.m_reserved;
    pr1.m_context_locale_id = ON_ParseSettings::FalseSettings.m_reserved._4_2_;
    pr1.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_reserved._6_1_;
    pr1.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_reserved._7_1_;
    parse_settings_00.m_false_default_bits[0] = input_parse_settings.m_true_default_bits[0];
    parse_settings_00.m_false_default_bits[1] = input_parse_settings.m_true_default_bits[1];
    parse_settings_00.m_true_default_bits[0] = (undefined4)pr.m_reserved;
    parse_settings_00.m_true_default_bits[1] = pr.m_reserved._4_4_;
    parse_settings_00._16_8_ = input_parse_settings.m_false_default_bits;
    parse_settings_00.m_reserved._0_4_ = input_parse_settings.m_reserved_bits;
    parse_settings_00.m_reserved._4_2_ = input_parse_settings.m_context_locale_id;
    parse_settings_00.m_reserved._6_1_ = input_parse_settings.m_context_angle_unit_system;
    parse_settings_00.m_reserved._7_1_ = input_parse_settings.m_context_length_unit_system;
    local_c4 = ON_ParseNumberExpression
                         (pwStack_18 + (int)cSurveyorsNotationEW,local_1e4,parse_settings_00,
                          (ON_ParseSettings *)auStack_c0,&stack0xffffffffffffffc0);
    if (local_c4 < 1) {
      bVar10 = ON_ParseSettings::ParseScientificENotation((ON_ParseSettings *)&pr.m_reserved);
      if (bVar10) {
        ON_ParseSettings::SetParseScientificENotation((ON_ParseSettings *)&pr.m_reserved,false);
        parse_settings_01.m_false_default_bits[0] = input_parse_settings.m_true_default_bits[0];
        parse_settings_01.m_false_default_bits[1] = input_parse_settings.m_true_default_bits[1];
        parse_settings_01.m_true_default_bits[0] = (undefined4)pr.m_reserved;
        parse_settings_01.m_true_default_bits[1] = pr.m_reserved._4_4_;
        parse_settings_01._16_8_ = input_parse_settings.m_false_default_bits;
        parse_settings_01.m_reserved._0_4_ = input_parse_settings.m_reserved_bits;
        parse_settings_01.m_reserved._4_2_ = input_parse_settings.m_context_locale_id;
        parse_settings_01.m_reserved._6_1_ = input_parse_settings.m_context_angle_unit_system;
        parse_settings_01.m_reserved._7_1_ = input_parse_settings.m_context_length_unit_system;
        local_c4 = ON_ParseNumberExpression
                             (pwStack_18 + (int)cSurveyorsNotationEW,pr1.m_reserved._4_4_,
                              parse_settings_01,(ON_ParseSettings *)&str_index,
                              &stack0xffffffffffffffc0);
        if (local_c4 < 1) {
          return 0;
        }
        if ((pwStack_18[local_c4] != L'E') && (pwStack_18[local_c4] != L'e')) {
          return 0;
        }
      }
    }
    else {
      if ((dStack_40 <= 0.0) &&
         (bVar10 = Internal_IsNegativeInteger
                             ((ON_ParseSettings *)&pr.m_reserved,
                              pwStack_18 + (int)cSurveyorsNotationEW,local_c4 - cSurveyorsNotationEW
                             ), bVar10)) {
        bVar1 = true;
      }
      ON_ParseSettings::operator|=((ON_ParseSettings *)&str_index,(ON_ParseSettings *)auStack_c0);
    }
    cSurveyorsNotationEW = local_c4 + cSurveyorsNotationEW;
  }
  else {
    parse_settings_02.m_false_default_bits[0] = input_parse_settings.m_true_default_bits[0];
    parse_settings_02.m_false_default_bits[1] = input_parse_settings.m_true_default_bits[1];
    parse_settings_02.m_true_default_bits[0] = (undefined4)pr.m_reserved;
    parse_settings_02.m_true_default_bits[1] = pr.m_reserved._4_4_;
    parse_settings_02._16_8_ = input_parse_settings.m_false_default_bits;
    parse_settings_02.m_reserved._0_4_ = input_parse_settings.m_reserved_bits;
    parse_settings_02.m_reserved._4_2_ = input_parse_settings.m_context_locale_id;
    parse_settings_02.m_reserved._6_1_ = input_parse_settings.m_context_angle_unit_system;
    parse_settings_02.m_reserved._7_1_ = input_parse_settings.m_context_length_unit_system;
    cSurveyorsNotationEW =
         ON_ParseNumberExpression
                   (pwStack_18,angle_value_local._4_4_,parse_settings_02,
                    (ON_ParseSettings *)&str_index,&stack0xffffffffffffffc0);
    if ((int)cSurveyorsNotationEW < 1) {
      return 0;
    }
    if ((dStack_40 <= 0.0) &&
       (bVar10 = Internal_IsNegativeInteger
                           ((ON_ParseSettings *)&pr.m_reserved,pwStack_18,cSurveyorsNotationEW),
       bVar10)) {
      bVar1 = true;
    }
  }
  if (0 < angle_value_local._4_4_) {
    if (angle_value_local._4_4_ < (int)cSurveyorsNotationEW) {
      return 0;
    }
    angle_value_local._4_4_ = angle_value_local._4_4_ - cSurveyorsNotationEW;
  }
  iVar12 = angle_value_local._4_4_;
  str_00 = pwStack_18 + (int)cSurveyorsNotationEW;
  uVar11 = ON_ParseSettings::PreferedLocaleId(&parse_settings);
  next_parse_settings.m_reserved._4_4_ =
       ON_ParseAngleUnitName
                 (str_00,iVar12,uVar11,
                  (AngleUnitSystem *)((long)&input_parse_settings.m_reserved + 7));
  if ((bVar1) && (input_parse_settings.m_reserved._7_1_ != Degrees)) {
    bVar1 = false;
  }
  if (next_parse_settings.m_reserved._4_4_ < 1) {
    input_parse_settings.m_reserved._7_1_ =
         ON_ParseSettings::DefaultAngleUnitSystem(&parse_settings);
  }
  else {
    if (0 < angle_value_local._4_4_) {
      if (angle_value_local._4_4_ < next_parse_settings.m_reserved._4_4_) {
        return 0;
      }
      angle_value_local._4_4_ = angle_value_local._4_4_ - next_parse_settings.m_reserved._4_4_;
    }
    cSurveyorsNotationEW = next_parse_settings.m_reserved._4_4_ + cSurveyorsNotationEW;
    if (((angle_value_local._4_4_ == -1) ||
        ((int)(cSurveyorsNotationEW + 1) < angle_value_local._4_4_)) &&
       (input_parse_settings.m_reserved._7_1_ == Degrees)) {
      dVar13 = floor(dStack_40);
      if (((((dVar13 == dStack_40) && (!NAN(dVar13) && !NAN(dStack_40))) &&
           ((bVar10 = ON_ParseSettings::ParseArcDegreesMinutesSeconds
                                ((ON_ParseSettings *)&pr.m_reserved), bVar10 &&
            ((bVar10 = ON_ParseSettings::ParseSignificandDecimalPoint
                                 ((ON_ParseSettings *)&str_index), !bVar10 &&
             (bVar10 = ON_ParseSettings::ParseScientificENotation((ON_ParseSettings *)&str_index),
             !bVar10)))))) &&
          (bVar10 = ON_ParseSettings::ParseRationalNumber((ON_ParseSettings *)&str_index), !bVar10))
         && ((((bVar10 = ON_ParseSettings::ParsePi((ON_ParseSettings *)&str_index), !bVar10 &&
               (bVar10 = ON_ParseSettings::ParseDivision((ON_ParseSettings *)&str_index), !bVar10))
              && (bVar10 = ON_ParseSettings::ParseMultiplication((ON_ParseSettings *)&str_index),
                 !bVar10)) &&
             (bVar10 = ON_ParseSettings::ParseIntegerDashFraction((ON_ParseSettings *)&str_index),
             !bVar10)))) {
        arc_minutes_value = (double)pr.m_reserved;
        next_parse_settings.m_true_default_bits[0] = input_parse_settings.m_true_default_bits[0];
        next_parse_settings.m_true_default_bits[1] = input_parse_settings.m_true_default_bits[1];
        next_parse_settings.m_false_default_bits[0] = input_parse_settings.m_false_default_bits[0];
        next_parse_settings.m_false_default_bits[1] = input_parse_settings.m_false_default_bits[1];
        next_parse_settings.m_reserved_bits = input_parse_settings.m_reserved_bits;
        next_parse_settings.m_context_locale_id = input_parse_settings.m_context_locale_id;
        next_parse_settings.m_context_angle_unit_system =
             input_parse_settings.m_context_angle_unit_system;
        next_parse_settings.m_context_length_unit_system =
             input_parse_settings.m_context_length_unit_system;
        DisableStartAndExpressionParsingStuff((ON_ParseSettings *)&arc_minutes_value);
        ON_ParseSettings::SetParseSignificandDigitSeparators
                  ((ON_ParseSettings *)&arc_minutes_value,false);
        ON_ParseSettings::SetParseIntegerDashFraction((ON_ParseSettings *)&arc_minutes_value,false);
        ON_ParseSettings::SetParseRationalNumber((ON_ParseSettings *)&arc_minutes_value,false);
        ON_ParseSettings::SetParsePi((ON_ParseSettings *)&arc_minutes_value,false);
        ON_ParseSettings::SetParseSurveyorsNotation((ON_ParseSettings *)&arc_minutes_value,false);
        ON_ParseSettings::SetParseUnaryMinus((ON_ParseSettings *)&arc_minutes_value,false);
        ON_ParseSettings::SetParseUnaryPlus((ON_ParseSettings *)&arc_minutes_value,false);
        arc_seconds_value = 0.0;
        dStack_160 = 0.0;
        for (next_value._4_4_ = 0; next_value._4_4_ < 2; next_value._4_4_ = next_value._4_4_ + 1) {
          dStack_170 = -1.23432101234321e+308;
          next_pr.m_reserved._7_1_ = '\0';
          auStack_198 = (undefined1  [4])ON_ParseSettings::FalseSettings.m_true_default_bits[0];
          next_str_index = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
          next_pr.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
          next_pr.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
          next_pr.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
          next_pr.m_reserved_bits = (undefined4)ON_ParseSettings::FalseSettings.m_reserved;
          next_pr.m_context_locale_id = ON_ParseSettings::FalseSettings.m_reserved._4_2_;
          next_pr.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_reserved._6_1_;
          next_pr.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_reserved._7_1_;
          if (angle_value_local._4_4_ == -1) {
            local_1fc = angle_value_local._4_4_;
          }
          else {
            local_1fc = (angle_value_local._4_4_ - cSurveyorsNotationEW) + -1;
          }
          parse_settings_03.m_false_default_bits[0] = next_parse_settings.m_true_default_bits[0];
          parse_settings_03.m_false_default_bits[1] = next_parse_settings.m_true_default_bits[1];
          parse_settings_03.m_true_default_bits = (ON__UINT32  [2])arc_minutes_value;
          parse_settings_03._16_8_ = next_parse_settings.m_false_default_bits;
          parse_settings_03.m_reserved._0_4_ = next_parse_settings.m_reserved_bits;
          parse_settings_03.m_reserved._4_2_ = next_parse_settings.m_context_locale_id;
          parse_settings_03.m_reserved._6_1_ = next_parse_settings.m_context_angle_unit_system;
          parse_settings_03.m_reserved._7_1_ = next_parse_settings.m_context_length_unit_system;
          iVar12 = ON_ParseAngleExpression
                             (pwStack_18 + (int)cSurveyorsNotationEW,local_1fc,parse_settings_03,
                              &stack0xfffffffffffffe90,(ON_ParseSettings *)auStack_198,
                              (AngleUnitSystem *)((long)&next_pr.m_reserved + 7));
          if (iVar12 < 1) break;
          if ((dStack_170 < 0.0) || (60.0 <= dStack_170)) {
            bVar1 = false;
            break;
          }
          if (next_value._4_4_ == 0) {
            if (next_pr.m_reserved._7_1_ != '\x04') {
              if (next_pr.m_reserved._7_1_ != '\x05') {
                bVar1 = false;
                break;
              }
              next_value._4_4_ = 1;
            }
          }
          else if ((next_value._4_4_ == 1) && (next_pr.m_reserved._7_1_ != '\x05')) {
            bVar1 = false;
            break;
          }
          if (next_pr.m_reserved._7_1_ == '\x04') {
            arc_seconds_value = dStack_170;
          }
          else if (next_pr.m_reserved._7_1_ == '\x05') {
            dStack_160 = dStack_170;
          }
          else {
            bVar1 = false;
          }
          cSurveyorsNotationEW = iVar12 + cSurveyorsNotationEW;
          ON_ParseSettings::SetParseArcDegreesMinutesSeconds((ON_ParseSettings *)&str_index,true);
          ON_ParseSettings::operator|=
                    ((ON_ParseSettings *)&str_index,(ON_ParseSettings *)auStack_198);
        }
        if ((((bVar1) && (dStack_40 <= 0.0)) && (0.0 <= arc_seconds_value)) && (0.0 <= dStack_160))
        {
          if (0.0 < arc_seconds_value) {
            arc_seconds_value = -arc_seconds_value;
          }
          if (0.0 < dStack_160) {
            dStack_160 = -dStack_160;
          }
        }
        if ((dStack_160 != 0.0) || (NAN(dStack_160))) {
          dStack_40 = (dStack_40 * 60.0 + arc_seconds_value) * 60.0 + dStack_160;
          input_parse_settings.m_reserved._7_1_ = Seconds;
        }
        else if ((arc_seconds_value != 0.0) || (NAN(arc_seconds_value))) {
          dStack_40 = dStack_40 * 60.0 + arc_seconds_value;
          input_parse_settings.m_reserved._7_1_ = Minutes;
        }
      }
    }
  }
  if (parse_results_local != (ON_ParseSettings *)0x0) {
    *(double *)parse_results_local->m_true_default_bits = dStack_40;
  }
  if (str_angle_unit_system_local != (AngleUnitSystem *)0x0) {
    *(ON__UINT32 (*) [2])str_angle_unit_system_local = _str_index;
    *(ON__UINT32 (*) [2])(str_angle_unit_system_local + 8) = pr.m_true_default_bits;
    *(ON__UINT32 (*) [2])(str_angle_unit_system_local + 0x10) = pr.m_false_default_bits;
    *(undefined8 *)(str_angle_unit_system_local + 0x18) = pr._16_8_;
  }
  if (x != 0.0) {
    *(AngleUnitSystem *)x = input_parse_settings.m_reserved._7_1_;
  }
  return cSurveyorsNotationEW;
}

Assistant:

int ON_ParseAngleExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  double* angle_value,
  ON_ParseSettings* parse_results,
  ON::AngleUnitSystem* str_angle_unit_system
  )
{
  double x = ON_UNSET_VALUE;
  ON::AngleUnitSystem angle_us = ON::AngleUnitSystem::None;
  ON_ParseSettings input_parse_settings(parse_settings);
  ON_ParseSettings pr = ON_ParseSettings::FalseSettings;
  if ( 0 != angle_value )
    *angle_value = ON_UNSET_VALUE;
  if ( 0 != str_angle_unit_system )
    *str_angle_unit_system = angle_us;
  if ( 0 != parse_results )
    *parse_results = pr;

  bool bNegativeDegreesMinutesSecondsIsPossible = false;
  int str_index = 0;
  ON__UINT32 cSurveyorsNotationNS = 0;
  ON__UINT32 cSurveyorsNotationEW = 0;
  if ( input_parse_settings.ParseSurveyorsNotation() )
  {
    if (    (str_index < str_count || -1 == str_count)
         && input_parse_settings.ParseLeadingWhiteSpace() 
         && input_parse_settings.IsLeadingWhiteSpace(str[str_index])
       )
    {
      // skip over leading white space
      pr.SetParseLeadingWhiteSpace(true);
      while ( str_index < str_count && input_parse_settings.IsLeadingWhiteSpace(str[str_index]) )
      {
        str_index++;
      }
    }

    input_parse_settings.SetParseLeadingWhiteSpace(false);

    if ( ((str_index+3 <= str_count) || -1 == str_count) )
    {
      // Do not localize "N" or "n" or "S" or "s".  
      // These letters are specified by Surveyor's notation specification.
      // [TODO - Reference needed].
      switch(str[str_index])
      {
      case 'N': // Do not localize this letter
      case 'n': // Do not localize this letter
        str_index++;
        cSurveyorsNotationNS = 'N';
        break;
      case 'S': // Do not localize this letter
      case 's': // Do not localize this letter
        str_index++;
        cSurveyorsNotationNS = 'S';
        break;
      }
    }

    if ( 0 != cSurveyorsNotationNS )
    {
      input_parse_settings.SetParseIntegerDashFraction(false);
    }

    const int str_number_count = (str_count > 0 ? str_count-str_index : str_count);
    ON_ParseSettings pr1(ON_ParseSettings::FalseSettings);
    int str_number_index = ON_ParseNumberExpression(str+str_index,str_number_count,input_parse_settings,&pr1,&x);
    if ( str_number_index > 0 )
    {
      if (0 == cSurveyorsNotationNS && x <= 0.0 && Internal_IsNegativeInteger(input_parse_settings, str + str_index, str_number_index - str_index))
        bNegativeDegreesMinutesSecondsIsPossible = true;
      pr |= pr1;
    }
    else
    {
      if ( input_parse_settings.ParseScientificENotation() )
      {
        // It may be that the string looked like N15.23E and the number parser failed
        // because 15.23E is an invalid attempt at using scientific E notation.
        input_parse_settings.SetParseScientificENotation(false);
        str_number_index = ON_ParseNumberExpression(str+str_index,str_number_count,input_parse_settings,&pr,&x);
        if ( str_number_index <= 0 )
          return 0;
        if ( 'E' != str[str_number_index] && 'e' != str[str_number_index] )
          return 0;
      }
    }
    str_index += str_number_index;
  }
  else
  {
    str_index = ON_ParseNumberExpression(str,str_count,input_parse_settings,&pr,&x);
    if ( str_index <= 0 )
      return 0;
    if (0 == cSurveyorsNotationNS && x <= 0.0 && Internal_IsNegativeInteger(input_parse_settings, str, str_index))
      bNegativeDegreesMinutesSecondsIsPossible = true;
  }

  if ( str_count > 0 )
  {
    if (str_index > str_count )
      return 0;
    str_count -= str_index;
  }

  int end_of_unit_index = ON_ParseAngleUnitName(str+str_index,str_count,parse_settings.PreferedLocaleId(),&angle_us);

  if (bNegativeDegreesMinutesSecondsIsPossible && ON::AngleUnitSystem::Degrees != angle_us)
    bNegativeDegreesMinutesSecondsIsPossible = false;

  if ( end_of_unit_index > 0 )
  {
    if ( str_count > 0 )
    {
      if (end_of_unit_index > str_count )
        return 0;
      str_count -= end_of_unit_index;
    }
    str_index += end_of_unit_index;

    if ( -1 == str_count || str_index+1 < str_count )
    {
      if ( ON::AngleUnitSystem::Degrees == angle_us 
           && floor(x) == x
           && input_parse_settings.ParseArcDegreesMinutesSeconds() 
           && false == pr.ParseSignificandDecimalPoint()
           && false == pr.ParseScientificENotation()
           && false == pr.ParseRationalNumber()
           && false == pr.ParsePi()
           && false == pr.ParseDivision()
           && false == pr.ParseMultiplication()
           && false == pr.ParseIntegerDashFraction()
         )
      {
        // parse arc minutes
        ON_ParseSettings next_parse_settings = input_parse_settings;
        DisableStartAndExpressionParsingStuff(next_parse_settings);
        next_parse_settings.SetParseSignificandDigitSeparators(false);
        next_parse_settings.SetParseIntegerDashFraction(false);
        next_parse_settings.SetParseRationalNumber(false);
        next_parse_settings.SetParsePi(false);
        next_parse_settings.SetParseSurveyorsNotation(false);
        next_parse_settings.SetParseUnaryMinus(false);
        next_parse_settings.SetParseUnaryPlus(false);

        double arc_minutes_value = 0.0;
        double arc_seconds_value = 0.0;

        for ( int next_value_pass = 0; next_value_pass < 2; next_value_pass++ )
        {
          double next_value = ON_UNSET_VALUE;
          ON::AngleUnitSystem next_us(ON::AngleUnitSystem::None);
          ON_ParseSettings next_pr(ON_ParseSettings::FalseSettings);
          int next_str_index = ON_ParseAngleExpression(
            str+str_index,
            ((-1 == str_count) ? str_count : (str_count-str_index-1)),
            next_parse_settings,&next_value,&next_pr,&next_us);

          if ( next_str_index <= 0 )
            break;

          if (!(next_value >= 0.0 && next_value < 60.0))
          {
            bNegativeDegreesMinutesSecondsIsPossible = false;
            break;
          }

          if ( 0 == next_value_pass )
          {
            if ( ON::AngleUnitSystem::Minutes != next_us )
            {
              if ( ON::AngleUnitSystem::Seconds == next_us && 0 == next_value_pass )
                next_value_pass = 1;
              else
              {
                bNegativeDegreesMinutesSecondsIsPossible = false;
                break;
              }
            }
          }
          else if ( 1 == next_value_pass )
          {
            if (ON::AngleUnitSystem::Seconds != next_us)
            {
              bNegativeDegreesMinutesSecondsIsPossible = false;              
              break;
            }
          }

          if (ON::AngleUnitSystem::Minutes == next_us)
            arc_minutes_value = next_value;
          else if (ON::AngleUnitSystem::Seconds == next_us)
            arc_seconds_value = next_value;
          else
            bNegativeDegreesMinutesSecondsIsPossible = false;

          str_index += next_str_index;
          pr.SetParseArcDegreesMinutesSeconds(true);
          pr |= next_pr;
        }

        if (
          bNegativeDegreesMinutesSecondsIsPossible
          && x <= 0.0 
          && arc_minutes_value >= 0.0 
          && arc_seconds_value >= 0.0
          )
        {
          // parsing something like -90d40'30"
          if (arc_minutes_value > 0.0)
            arc_minutes_value = -arc_minutes_value;
          if (arc_seconds_value > 0.0)
            arc_seconds_value = -arc_seconds_value;
        }

        if ( 0 != arc_seconds_value )
        {
          x = 60.0*(60.0*x + arc_minutes_value) + arc_seconds_value;
          angle_us = ON::AngleUnitSystem::Seconds;
        }
        else if ( 0 != arc_minutes_value )
        {
          x = 60.0*x + arc_minutes_value;
          angle_us = ON::AngleUnitSystem::Minutes;
        }
      }
    }
  }
  else
  {
    bNegativeDegreesMinutesSecondsIsPossible = false;
    angle_us = parse_settings.DefaultAngleUnitSystem();
  }

  if ( str_index > 0 && 0 != cSurveyorsNotationNS )
  {
    if ( str_count > 0 )
    {
      if (str_index+1 > str_count )
        return 0;
    }

    // Do not localize "E" or "e" or "W" or "w".  
    // These letters are specified by Surveyor's notation specification.
    // [TODO - Reference needed].
    switch(str[str_index])
    {
    case 'E': // Do not localize this letter
    case 'e': // Do not localize this letter
      str_index++;
      cSurveyorsNotationEW = 'E';
      break;
    case 'W': // Do not localize this letter
    case 'w': // Do not localize this letter
      str_index++;
      cSurveyorsNotationEW = 'W';
      break;
    default:
      cSurveyorsNotationEW = 0;
      break;
    }

    if (0 == cSurveyorsNotationEW )
      return 0;

    if ( ON::AngleUnitSystem::None == angle_us )
    {
      // Surveyor's notation implies degrees when no angle unit
      // is explicitly supplied.  This is done because it is
      // difficult for many users to enter a degree symbol
      // when typing input and Surveyor's notation is almost
      // always in degrees. [TODO cite reference].
      angle_us = ON::AngleUnitSystem::Degrees;
    }

    // The value of right_angle is calculated this way because it will
    // yield the most precise result in all angle unit systems since
    // IEEE double multiplication by 0.25 is exact and the value
    // returned by ON::AngleUnitScale(ON::turns,angle_us) is exact 
    // for all supported angle units except radians where pi rounded
    // because the IEEE double must approximate the value of pi.
    const double right_angle = 0.25*ON::AngleUnitScale(ON::AngleUnitSystem::Turns,angle_us);

    switch(cSurveyorsNotationNS)
    {
    case 'N':
      switch(cSurveyorsNotationEW)
      {
      case 'E': // N<angle>E
        x = right_angle - x;
        break;
      case 'W': // N<angle>W
        x = right_angle + x;
        break;
      default:
        return 0;
      }
      break;
    case 'S':
      switch(cSurveyorsNotationEW)
      {
      case 'E': // S<angle>E
        x =  -(right_angle - x);
        break;
      case 'W': // S<angle>W
        x =  -(right_angle + x);
        break;
      default:
        return 0;
      }
      break;
    default:
      return 0;
    }
  }

  if ( angle_value )
    *angle_value = x;
  if ( 0 != parse_results )
    *parse_results = pr;
  if ( 0 != str_angle_unit_system )
    *str_angle_unit_system = angle_us;

  return str_index;
}